

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O3

void __thiscall BS::thread_pool::thread_pool(thread_pool *this,concurrency_t thread_count_)

{
  deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *pdVar1;
  int iVar2;
  concurrency_t cVar3;
  ulong *puVar4;
  pointer *__ptr;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  
  this->paused = (__atomic_base<bool>)0x0;
  this->running = (__atomic_base<bool>)0x0;
  std::condition_variable::condition_variable(&this->task_available_cv);
  std::condition_variable::condition_variable(&this->task_done_cv);
  auVar6 = ZEXT816(0) << 0x40;
  (this->tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish = (iterator)ZEXT1632(auVar6);
  *(undefined1 (*) [32])
   &(this->tasks).c.
    super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = ZEXT1632(auVar6);
  auVar7 = ZEXT1632(auVar6);
  pdVar1 = &(this->tasks).c;
  (pdVar1->super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>).
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)auVar7._0_8_;
  (pdVar1->super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>).
  _M_impl.super__Deque_impl_data._M_map_size = auVar7._8_8_;
  (pdVar1->super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>).
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)auVar7._16_8_;
  (pdVar1->super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>).
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)auVar7._24_8_;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )&this->tasks,0);
  *(undefined8 *)((long)&(this->tasks_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tasks_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->tasks_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->tasks_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->tasks_total).super___atomic_base<unsigned_long>._M_i = 0;
  (this->tasks_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tasks_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tasks_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  if (thread_count_ == 0) {
    iVar2 = std::thread::hardware_concurrency();
    thread_count_ = 1;
    cVar3 = 1;
    if (iVar2 != 0) {
      cVar3 = std::thread::hardware_concurrency();
    }
    this->thread_count = cVar3;
    iVar2 = std::thread::hardware_concurrency();
    if (iVar2 != 0) {
      thread_count_ = std::thread::hardware_concurrency();
    }
  }
  else {
    this->thread_count = thread_count_;
  }
  uVar5 = (ulong)thread_count_;
  puVar4 = (ulong *)operator_new__(uVar5 * 8 + 8);
  *puVar4 = uVar5;
  if (uVar5 != 0) {
    memset((thread *)(puVar4 + 1),0,uVar5 << 3);
  }
  (this->threads)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)(puVar4 + 1);
  (this->waiting)._M_base._M_i = false;
  create_threads(this);
  return;
}

Assistant:

thread_pool(const concurrency_t thread_count_ = 0) : thread_count(determine_thread_count(thread_count_)), threads(std::make_unique<std::thread[]>(determine_thread_count(thread_count_)))
    {
        create_threads();
    }